

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevolute.cpp
# Opt level: O2

void __thiscall chrono::ChLinkRevolute::ChLinkRevolute(ChLinkRevolute *this)

{
  int i;
  long lVar1;
  ChVector<double> local_48;
  ChQuaternion<double> local_30;
  
  ChLink::ChLink(&this->super_ChLink);
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChLinkRevolute_01169040;
  local_30.m_data[0] = 1.0;
  local_48.m_data[2] = 0.0;
  local_30.m_data[3] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_30.m_data[1] = 0.0;
  local_30.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&this->m_frame1,&local_48,&local_30);
  local_48.m_data[2] = 0.0;
  local_30.m_data[0] = 1.0;
  local_30.m_data[3] = 0.0;
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_30.m_data[1] = 0.0;
  local_30.m_data[2] = 0.0;
  ChFrame<double>::ChFrame(&this->m_frame2,&local_48,&local_30);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_x);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_y);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_z);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_uw);
  ChConstraintTwoBodies::ChConstraintTwoBodies(&this->m_cnstr_vw);
  for (lVar1 = 0; lVar1 != 5; lVar1 = lVar1 + 1) {
    this->m_multipliers[lVar1] = 0.0;
  }
  return;
}

Assistant:

ChLinkRevolute::ChLinkRevolute() {
    for (int i = 0; i < 5; i++) {
        m_multipliers[i] = 0;
    }
}